

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::HasProperty
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,bool *noRedecl,PropertyValueInfo *info)

{
  BOOL BVar1;
  uint32 local_44;
  ScriptContext *pSStack_40;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  bool *noRedecl_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)noRedecl;
  noRedecl_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSStack_40 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  if (info_local != (PropertyValueInfo *)0x0) {
    *(undefined1 *)&info_local->m_instance = 0;
  }
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_40,noRedecl_local._4_4_,&local_44);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DictionaryTypeHandlerBase<unsigned_short>::HasProperty
                   (&this->super_DictionaryTypeHandlerBase<unsigned_short>,pDStack_20,
                    noRedecl_local._4_4_,(bool *)info_local,(PropertyValueInfo *)scriptContext);
  }
  else {
    this_local._4_4_ = HasItem(this,pDStack_20,local_44);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::HasProperty(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 index;

        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            // Call my version of HasItem
            return ES5ArrayTypeHandlerBase<T>::HasItem(instance, index);
        }

        return __super::HasProperty(instance, propertyId, noRedecl, info);
    }